

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

ostream * mjs::operator<<(ostream *os,token *t)

{
  ostream *poVar1;
  allocator<char> local_1f1;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_1f0;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_1e8;
  string local_1e0 [32];
  wstring local_1c0 [8];
  __string_type s;
  wostringstream local_190 [8];
  wostringstream oss;
  token *t_local;
  ostream *os_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  operator<<((wostream *)local_190,t);
  std::__cxx11::wostringstream::str();
  local_1e8._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  local_1f0._M_current = (wchar_t *)std::__cxx11::wstring::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
            (local_1e0,local_1e8,local_1f0,&local_1f1);
  poVar1 = std::operator<<(os,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::wstring::~wstring(local_1c0);
  std::__cxx11::wostringstream::~wostringstream(local_190);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const token& t) {
    std::wostringstream oss;
    oss << t;
    auto s = oss.str();
    return os << std::string{s.begin(),s.end()};
}